

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::BeginDataSegment
          (BinaryReaderIR *this,Index index,Index memory_index,bool passive)

{
  char *pcVar1;
  Offset OVar2;
  DataSegmentModuleField *pDVar3;
  undefined1 local_b0 [8];
  Location loc_1;
  Location loc;
  DataSegmentModuleField *local_40;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_38;
  
  pcVar1 = this->filename_;
  strlen(pcVar1);
  loc_1.field_1._8_8_ = pcVar1;
  MakeUnique<wabt::DataSegmentModuleField,wabt::Location>
            ((wabt *)&local_40,(Location *)((long)&loc_1.field_1 + 8));
  pDVar3 = local_40;
  pcVar1 = this->filename_;
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.line = 0;
  loc_1.filename.data_ = (char *)strlen(pcVar1);
  local_b0 = (undefined1  [8])pcVar1;
  loc_1.filename.size_ = OVar2;
  Var::Var((Var *)((long)&loc_1.field_1 + 8),memory_index,(Location *)local_b0);
  Var::operator=(&(pDVar3->data_segment).memory_var,(Var *)((long)&loc_1.field_1 + 8));
  Var::~Var((Var *)((long)&loc_1.field_1 + 8));
  (pDVar3->data_segment).passive = passive;
  local_38._M_head_impl = local_40;
  local_40 = (DataSegmentModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                       *)&local_38);
  if (local_38._M_head_impl != (DataSegmentModuleField *)0x0) {
    (*((local_38._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_38._M_head_impl = (DataSegmentModuleField *)0x0;
  if (local_40 != (DataSegmentModuleField *)0x0) {
    (**(code **)(*(long *)local_40 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginDataSegment(Index index,
                                        Index memory_index,
                                        bool passive) {
  auto field = MakeUnique<DataSegmentModuleField>(GetLocation());
  DataSegment& data_segment = field->data_segment;
  data_segment.memory_var = Var(memory_index, GetLocation());
  data_segment.passive = passive;
  module_->AppendField(std::move(field));
  return Result::Ok;
}